

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpztetrahedron.cpp
# Opt level: O0

void pztopology::TPZTetrahedron::TShape<double>
               (TPZVec<double> *loc,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double dVar1;
  double *pdVar2;
  TPZVec<double> *in_RDI;
  double dVar3;
  double zeta;
  double eta;
  double qsi;
  int64_t in_stack_ffffffffffffffc0;
  double col;
  int64_t in_stack_ffffffffffffffc8;
  TPZFMatrix<double> *this;
  TPZFMatrix<double> *this_00;
  
  pdVar2 = TPZVec<double>::operator[](in_RDI,0);
  dVar1 = *pdVar2;
  pdVar2 = TPZVec<double>::operator[](in_RDI,1);
  col = *pdVar2;
  pdVar2 = TPZVec<double>::operator[](in_RDI,2);
  this = (TPZFMatrix<double> *)*pdVar2;
  dVar3 = ((1.0 - dVar1) - col) - (double)this;
  pdVar2 = TPZFMatrix<double>::operator()(this,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  *pdVar2 = dVar3;
  pdVar2 = TPZFMatrix<double>::operator()(this,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  *pdVar2 = dVar1;
  pdVar2 = TPZFMatrix<double>::operator()(this,in_stack_ffffffffffffffc8,(int64_t)col);
  *pdVar2 = col;
  this_00 = this;
  pdVar2 = TPZFMatrix<double>::operator()(this,(int64_t)this,(int64_t)col);
  *pdVar2 = (double)this;
  pdVar2 = TPZFMatrix<double>::operator()(this_00,(int64_t)this,(int64_t)col);
  *pdVar2 = -1.0;
  pdVar2 = TPZFMatrix<double>::operator()(this_00,(int64_t)this,(int64_t)col);
  *pdVar2 = -1.0;
  pdVar2 = TPZFMatrix<double>::operator()(this_00,(int64_t)this,(int64_t)col);
  *pdVar2 = -1.0;
  pdVar2 = TPZFMatrix<double>::operator()(this_00,(int64_t)this,(int64_t)col);
  *pdVar2 = 1.0;
  pdVar2 = TPZFMatrix<double>::operator()(this_00,(int64_t)this,(int64_t)col);
  *pdVar2 = 0.0;
  pdVar2 = TPZFMatrix<double>::operator()(this_00,(int64_t)this,(int64_t)col);
  *pdVar2 = 0.0;
  pdVar2 = TPZFMatrix<double>::operator()(this_00,(int64_t)this,(int64_t)col);
  *pdVar2 = 0.0;
  pdVar2 = TPZFMatrix<double>::operator()(this_00,(int64_t)this,(int64_t)col);
  *pdVar2 = 1.0;
  pdVar2 = TPZFMatrix<double>::operator()(this_00,(int64_t)this,(int64_t)col);
  *pdVar2 = 0.0;
  pdVar2 = TPZFMatrix<double>::operator()(this_00,(int64_t)this,(int64_t)col);
  *pdVar2 = 0.0;
  pdVar2 = TPZFMatrix<double>::operator()(this_00,(int64_t)this,(int64_t)col);
  *pdVar2 = 0.0;
  pdVar2 = TPZFMatrix<double>::operator()(this_00,(int64_t)this,(int64_t)col);
  *pdVar2 = 1.0;
  return;
}

Assistant:

inline void TPZTetrahedron::TShape(const TPZVec<T> &loc,TPZFMatrix<T> &phi,TPZFMatrix<T> &dphi) {
        T qsi = loc[0], eta = loc[1] , zeta  = loc[2];

        phi(0,0)  = 1.0-qsi-eta-zeta;
        phi(1,0)  = qsi;
        phi(2,0)  = eta;
        phi(3,0)  = zeta;

        dphi(0,0) = -1.0;
        dphi(1,0) = -1.0;
        dphi(2,0) = -1.0;
        dphi(0,1) =  1.0;
        dphi(1,1) =  0.0;
        dphi(2,1) =  0.0;
        dphi(0,2) =  0.0;
        dphi(1,2) =  1.0;
        dphi(2,2) =  0.0;
        dphi(0,3) =  0.0;
        dphi(1,3) =  0.0;
        dphi(2,3) =  1.0;

    }